

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::setEnabled_helper(QWidgetPrivate *this,bool enable)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  uint uVar3;
  QWidget *this_00;
  QWidget *pQVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  long lVar8;
  undefined8 uVar9;
  QWidget *pQVar10;
  byte *pbVar11;
  byte bVar12;
  undefined7 in_register_00000031;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if (((((int)CONCAT71(in_register_00000031,enable) != 0) &&
       (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) &&
      (lVar13 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar13 != 0)) &&
     ((*(byte *)(*(long *)(lVar13 + 0x20) + 8) & 1) != 0)) goto LAB_00300097;
  uVar3 = this_00->data->widget_attributes;
  bVar12 = (byte)uVar3;
  if (((bVar12 ^ enable) & 1) != 0) goto LAB_00300097;
  if (((bVar12 ^ enable) & 1) == 0) {
    this_00->data->widget_attributes = (uint)!enable | uVar3 & 0xfffffffe;
  }
  pQVar10 = this_00;
  if (enable) {
    lVar13 = 0;
  }
  else {
    do {
      puVar1 = &pQVar10->field_0x8;
      pQVar4 = *(QWidget **)(*(long *)puVar1 + 0x10);
      if (pQVar4 == (QWidget *)0x0) break;
      ppQVar2 = &pQVar10->data;
      pQVar10 = pQVar4;
    } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    lVar13 = -1;
    if ((*(QWidget **)(*(long *)puVar1 + 0x90) == this_00) &&
       (((lVar8 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar8 != 0 &&
         ((*(byte *)(*(long *)(lVar8 + 0x20) + 8) & 1) != 0)) ||
        (cVar6 = (**(code **)(*(long *)this_00 + 0x198))(this_00), cVar6 == '\0')))) {
      QWidget::clearFocus(this_00);
    }
  }
  if (*(long *)&this->field_0x28 != 0) {
    uVar14 = 0;
    do {
      lVar8 = *(long *)(*(long *)&this->field_0x20 + uVar14 * 8);
      if ((lVar8 == 0) || ((*(byte *)(*(long *)(lVar8 + 8) + 0x30) & 1) == 0)) {
        lVar8 = 0;
      }
      if (lVar8 != 0) {
        if (enable) {
          pbVar11 = (byte *)(*(long *)(lVar8 + 8) + lVar13 * 4 + 0x240);
        }
        else {
          pbVar11 = (byte *)(*(long *)(lVar8 + 0x20) + 8);
        }
        if ((*pbVar11 & 1) == 0) {
          setEnabled_helper(*(QWidgetPrivate **)(lVar8 + 8),enable);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(ulong *)&this->field_0x28);
  }
  if (((*(byte *)(*(long *)&this_00->field_0x8 + 0x240) & 0x40) != 0) ||
     (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    qt_qpa_set_cursor(this_00,false);
  }
  if (((this_00->data->widget_attributes & 0x4000) != 0) &&
     (bVar7 = QWidget::hasFocus(this_00), bVar7)) {
    lVar13 = *(long *)&this->field_0x8;
    lVar8 = *(long *)(*(long *)(lVar13 + 8) + 0x78);
    if ((lVar8 != 0) &&
       ((*(long *)(lVar8 + 0x30) != 0 && (*(int *)(*(long *)(lVar8 + 0x30) + 4) != 0)))) {
      while (lVar5 = *(long *)(lVar8 + 0x38), lVar5 != 0) {
        lVar8 = *(long *)(*(long *)(lVar5 + 8) + 0x78);
        lVar13 = lVar5;
        if (((lVar8 == 0) || (*(long *)(lVar8 + 0x30) == 0)) ||
           (*(int *)(*(long *)(lVar8 + 0x30) + 4) == 0)) break;
      }
    }
    if (enable) {
      if ((*(byte *)(*(long *)(lVar13 + 0x20) + 9) & 0x40) == 0) goto LAB_00300069;
    }
    else {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    uVar9 = QGuiApplication::inputMethod();
    QInputMethod::update(uVar9,1);
  }
LAB_00300069:
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,EnabledChange);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
LAB_00300097:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setEnabled_helper(bool enable)
{
    Q_Q(QWidget);

    if (enable && !q->isWindow() && q->parentWidget() && !q->parentWidget()->isEnabled())
        return; // nothing we can do

    if (enable != q->testAttribute(Qt::WA_Disabled))
        return; // nothing to do

    q->setAttribute(Qt::WA_Disabled, !enable);
    updateSystemBackground();

    if (!enable && q->window()->focusWidget() == q) {
        bool parentIsEnabled = (!q->parentWidget() || q->parentWidget()->isEnabled());
        if (!parentIsEnabled || !q->focusNextChild())
            q->clearFocus();
    }

    Qt::WidgetAttribute attribute = enable ? Qt::WA_ForceDisabled : Qt::WA_Disabled;
    for (int i = 0; i < children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(children.at(i));
        if (w && !w->testAttribute(attribute))
            w->d_func()->setEnabled_helper(enable);
    }
#ifndef QT_NO_CURSOR
    if (q->testAttribute(Qt::WA_SetCursor) || q->isWindow()) {
        // enforce the windows behavior of clearing the cursor on
        // disabled widgets
        qt_qpa_set_cursor(q, false);
    }
#endif
#ifndef QT_NO_IM
    if (q->testAttribute(Qt::WA_InputMethodEnabled) && q->hasFocus()) {
        QWidget *focusWidget = effectiveFocusWidget();

        if (enable) {
            if (focusWidget->testAttribute(Qt::WA_InputMethodEnabled))
                QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        } else {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
    }
#endif //QT_NO_IM
    QEvent e(QEvent::EnabledChange);
    QCoreApplication::sendEvent(q, &e);
}